

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_longnames.cpp
# Opt level: O1

LongNameHandler *
icu_63::number::impl::LongNameHandler::forCompoundUnit
          (Locale *loc,MeasureUnit *unit,MeasureUnit *perUnit,UNumberUnitWidth *width,
          PluralRules *rules,MicroPropsGenerator *parent,UErrorCode *status)

{
  UErrorCode UVar1;
  long lVar2;
  UChar *text;
  UnicodeString *pUVar3;
  SimpleFormatter compiled;
  LocalUResourceBundlePointer unitsBundle;
  UnicodeString rawPerUnitFormat;
  UnicodeString secondaryFormat;
  SimpleFormatter secondaryCompiled;
  UnicodeString secondaryString;
  UnicodeString perUnitFormat;
  int32_t local_65c;
  LongNameHandler *local_658;
  MeasureUnit *local_650;
  SimpleFormatter local_648;
  UnicodeString local_600;
  UnicodeString local_5c0;
  UnicodeString local_580;
  SimpleFormatter local_540;
  UnicodeString local_4f8;
  UnicodeString local_4b8;
  UnicodeString local_478;
  UnicodeString local_438 [7];
  UnicodeString local_278;
  UnicodeString local_238 [8];
  
  local_650 = perUnit;
  local_658 = (LongNameHandler *)UMemory::operator_new((UMemory *)0x2c0,(size_t)unit);
  if (local_658 == (LongNameHandler *)0x0) {
    local_658 = (LongNameHandler *)0x0;
  }
  else {
    LongNameHandler(local_658,rules,parent);
  }
  if (local_658 == (LongNameHandler *)0x0) {
    *status = U_MEMORY_ALLOCATION_ERROR;
    return (LongNameHandler *)0x0;
  }
  lVar2 = 0;
  do {
    *(undefined ***)((long)&local_238[0].super_Replaceable.super_UObject._vptr_UObject + lVar2) =
         &PTR__UnicodeString_003c0258;
    *(undefined2 *)((long)&local_238[0].fUnion + lVar2) = 2;
    lVar2 = lVar2 + 0x40;
  } while (lVar2 != 0x200);
  anon_unknown.dwarf_181a83::getMeasureData(loc,unit,width,local_238,status);
  if (U_ZERO_ERROR < *status) goto LAB_00260f93;
  lVar2 = 0;
  do {
    *(undefined ***)((long)&local_438[0].super_Replaceable.super_UObject._vptr_UObject + lVar2) =
         &PTR__UnicodeString_003c0258;
    *(undefined2 *)((long)&local_438[0].fUnion + lVar2) = 2;
    lVar2 = lVar2 + 0x40;
  } while (lVar2 != 0x200);
  anon_unknown.dwarf_181a83::getMeasureData(loc,local_650,width,local_438,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    local_4b8.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003c0258;
    local_4b8.fUnion.fStackFields.fLengthAndFlags = 2;
    if ((local_278.fUnion.fStackFields.fLengthAndFlags._0_1_ & 1) == 0) {
      UnicodeString::operator=(&local_4b8,&local_278);
LAB_00260d20:
      UnicodeString::UnicodeString(&local_478,&local_4b8);
      multiSimpleFormatsToModifiers(local_658,local_238,&local_478,UNUM_FIELD_COUNT,status);
      pUVar3 = &local_478;
LAB_00260f62:
      UnicodeString::~UnicodeString(pUVar3);
    }
    else {
      local_600.super_Replaceable.super_UObject._vptr_UObject =
           (UObject)ures_open_63("icudt63l-unit",loc->fullName,status);
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        MaybeStackArray<char,_40>::MaybeStackArray((MaybeStackArray<char,_40> *)&local_648);
        local_648.compiledPattern.fUnion._40_4_ = 0;
        *(char *)local_648._0_8_ = '\0';
        StringPiece::StringPiece((StringPiece *)&local_540,"units");
        CharString::append((CharString *)&local_648,(char *)local_540._0_8_,
                           (int32_t)local_540.compiledPattern.super_Replaceable.super_UObject.
                                    _vptr_UObject,status);
        if (*width == UNUM_UNIT_WIDTH_SHORT) {
          StringPiece::StringPiece((StringPiece *)&local_580,"Short");
LAB_00260e2f:
          CharString::append((CharString *)&local_648,
                             (char *)local_580.super_Replaceable.super_UObject._vptr_UObject,
                             local_580.fUnion._0_4_,status);
        }
        else if (*width == UNUM_UNIT_WIDTH_NARROW) {
          StringPiece::StringPiece((StringPiece *)&local_580,"Narrow");
          goto LAB_00260e2f;
        }
        StringPiece::StringPiece((StringPiece *)&local_4f8,"/compound/per");
        CharString::append((CharString *)&local_648,
                           (char *)local_4f8.super_Replaceable.super_UObject._vptr_UObject,
                           local_4f8.fUnion._0_4_,status);
        local_65c = 0;
        text = ures_getStringByKeyWithFallback_63
                         ((UResourceBundle *)local_600.super_Replaceable.super_UObject._vptr_UObject
                          ,(char *)local_648._0_8_,&local_65c,status);
        UnicodeString::UnicodeString(&local_5c0,text,local_65c);
        MaybeStackArray<char,_40>::~MaybeStackArray((MaybeStackArray<char,_40> *)&local_648);
      }
      else {
        local_5c0.super_Replaceable.super_UObject._vptr_UObject =
             (UObject)&PTR__UnicodeString_003c0258;
        local_5c0.fUnion.fStackFields.fLengthAndFlags = 2;
      }
      LocalUResourceBundlePointer::~LocalUResourceBundlePointer
                ((LocalUResourceBundlePointer *)&local_600);
      if (U_ZERO_ERROR < *status) {
LAB_00260f5a:
        pUVar3 = &local_5c0;
        goto LAB_00260f62;
      }
      SimpleFormatter::SimpleFormatter(&local_648,&local_5c0,2,2,status);
      if (U_ZERO_ERROR < *status) {
LAB_00260f50:
        SimpleFormatter::~SimpleFormatter(&local_648);
        goto LAB_00260f5a;
      }
      anon_unknown.dwarf_181a83::getWithPlural(&local_580,local_438,ONE,status);
      if (U_ZERO_ERROR < *status) {
LAB_00260f43:
        UnicodeString::~UnicodeString(&local_580);
        goto LAB_00260f50;
      }
      SimpleFormatter::SimpleFormatter(&local_540,&local_580,1,1,status);
      if (U_ZERO_ERROR < *status) {
        SimpleFormatter::~SimpleFormatter(&local_540);
        goto LAB_00260f43;
      }
      SimpleFormatter::getTextWithNoArguments(&local_600,&local_540);
      pUVar3 = UnicodeString::trim(&local_600);
      UnicodeString::UnicodeString(&local_4f8,pUVar3);
      UnicodeString::~UnicodeString(&local_600);
      UnicodeString::UnicodeString(&local_600,L"{0}");
      SimpleFormatter::format(&local_648,&local_600,&local_4f8,&local_4b8,status);
      UnicodeString::~UnicodeString(&local_600);
      UVar1 = *status;
      UnicodeString::~UnicodeString(&local_4f8);
      SimpleFormatter::~SimpleFormatter(&local_540);
      UnicodeString::~UnicodeString(&local_580);
      SimpleFormatter::~SimpleFormatter(&local_648);
      UnicodeString::~UnicodeString(&local_5c0);
      if (UVar1 < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_00260d20;
    }
    UnicodeString::~UnicodeString(&local_4b8);
  }
  lVar2 = 0x1c0;
  do {
    UnicodeString::~UnicodeString
              ((UnicodeString *)
               ((long)&local_438[0].super_Replaceable.super_UObject._vptr_UObject + lVar2));
    lVar2 = lVar2 + -0x40;
  } while (lVar2 != -0x40);
LAB_00260f93:
  lVar2 = 0x1c0;
  do {
    UnicodeString::~UnicodeString
              ((UnicodeString *)
               ((long)&local_238[0].super_Replaceable.super_UObject._vptr_UObject + lVar2));
    lVar2 = lVar2 + -0x40;
  } while (lVar2 != -0x40);
  return local_658;
}

Assistant:

LongNameHandler*
LongNameHandler::forCompoundUnit(const Locale &loc, const MeasureUnit &unit, const MeasureUnit &perUnit,
                                 const UNumberUnitWidth &width, const PluralRules *rules,
                                 const MicroPropsGenerator *parent, UErrorCode &status) {
    auto* result = new LongNameHandler(rules, parent);
    if (result == nullptr) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return nullptr;
    }
    UnicodeString primaryData[ARRAY_LENGTH];
    getMeasureData(loc, unit, width, primaryData, status);
    if (U_FAILURE(status)) { return result; }
    UnicodeString secondaryData[ARRAY_LENGTH];
    getMeasureData(loc, perUnit, width, secondaryData, status);
    if (U_FAILURE(status)) { return result; }

    UnicodeString perUnitFormat;
    if (!secondaryData[PER_INDEX].isBogus()) {
        perUnitFormat = secondaryData[PER_INDEX];
    } else {
        UnicodeString rawPerUnitFormat = getPerUnitFormat(loc, width, status);
        if (U_FAILURE(status)) { return result; }
        // rawPerUnitFormat is something like "{0}/{1}"; we need to substitute in the secondary unit.
        SimpleFormatter compiled(rawPerUnitFormat, 2, 2, status);
        if (U_FAILURE(status)) { return result; }
        UnicodeString secondaryFormat = getWithPlural(secondaryData, StandardPlural::Form::ONE, status);
        if (U_FAILURE(status)) { return result; }
        SimpleFormatter secondaryCompiled(secondaryFormat, 1, 1, status);
        if (U_FAILURE(status)) { return result; }
        UnicodeString secondaryString = secondaryCompiled.getTextWithNoArguments().trim();
        // TODO: Why does UnicodeString need to be explicit in the following line?
        compiled.format(UnicodeString(u"{0}"), secondaryString, perUnitFormat, status);
        if (U_FAILURE(status)) { return result; }
    }
    // TODO: What field to use for units?
    result->multiSimpleFormatsToModifiers(primaryData, perUnitFormat, UNUM_FIELD_COUNT, status);
    return result;
}